

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O3

void __thiscall duckdb::DataPointer::Serialize(DataPointer *this,Serializer *serializer)

{
  Serializer::WritePropertyWithDefault<unsigned_long>(serializer,100,"row_start",&this->row_start);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x65,"tuple_count",&this->tuple_count);
  Serializer::WriteProperty<duckdb::BlockPointer>
            (serializer,0x66,"block_pointer",&this->block_pointer);
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"compression_type");
  Serializer::WriteValue<duckdb::CompressionType>(serializer,this->compression_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WriteProperty<duckdb::BaseStatistics>(serializer,0x68,"statistics",&this->statistics);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ColumnSegmentState,std::default_delete<duckdb::ColumnSegmentState>,true>>
            (serializer,0x69,"segment_state",&this->segment_state);
  return;
}

Assistant:

void DataPointer::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<uint64_t>(100, "row_start", row_start);
	serializer.WritePropertyWithDefault<uint64_t>(101, "tuple_count", tuple_count);
	serializer.WriteProperty<BlockPointer>(102, "block_pointer", block_pointer);
	serializer.WriteProperty<CompressionType>(103, "compression_type", compression_type);
	serializer.WriteProperty<BaseStatistics>(104, "statistics", statistics);
	serializer.WritePropertyWithDefault<unique_ptr<ColumnSegmentState>>(105, "segment_state", segment_state);
}